

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void lhash_page_release(void *pUserData)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  SyMemBackend *pBackend;
  void *pChunk;
  
  lVar1 = *(long *)((long)pUserData + 8);
  pBackend = (SyMemBackend *)(*pUserData + 8);
  pChunk = *(void **)((long)pUserData + 0x28);
  for (uVar3 = 0; uVar3 < *(uint *)((long)pUserData + 0x38); uVar3 = uVar3 + 1) {
    pvVar2 = *(void **)((long)pChunk + 0x60);
    SyBlobRelease((SyBlob *)((long)pChunk + 0x40));
    SyMemBackendPoolFree(pBackend,pChunk);
    pChunk = pvVar2;
  }
  if (*(void **)((long)pUserData + 0x20) != (void *)0x0) {
    SyMemBackendFree(pBackend,*(void **)((long)pUserData + 0x20));
  }
  SyMemBackendPoolFree(pBackend,pUserData);
  *(undefined8 *)(lVar1 + 8) = 0;
  return;
}

Assistant:

static void lhash_page_release(void *pUserData)
{
	lhpage *pPage = (lhpage *)pUserData;
	lhash_kv_engine *pEngine = pPage->pHash;
	lhcell *pNext,*pCell = pPage->pList;
	unqlite_page *pRaw = pPage->pRaw;
	sxu32 n;
	/* Drop in-memory cells */
	for( n = 0 ; n < pPage->nCell ; ++n ){
		pNext = pCell->pNext;
		SyBlobRelease(&pCell->sKey);
		/* Release the cell instance */
		SyMemBackendPoolFree(&pEngine->sAllocator,(void *)pCell);
		/* Point to the next entry */
		pCell = pNext;
	}
	if( pPage->apCell ){
		/* Release the cell table */
		SyMemBackendFree(&pEngine->sAllocator,(void *)pPage->apCell);
	}
	/* Finally, release the whole page */
	SyMemBackendPoolFree(&pEngine->sAllocator,pPage);
	pRaw->pUserData = 0;
}